

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

MOJOSHADER_astExpression * new_identifier_expr(Context_conflict *ctx,char *string)

{
  MOJOSHADER_astExpressionIdentifier *retval;
  char *string_local;
  Context_conflict *ctx_local;
  
  ctx_local = (Context_conflict *)Malloc(ctx,0x30);
  if (ctx_local == (Context_conflict *)0x0) {
    ctx_local = (Context_conflict *)0x0;
  }
  else {
    ctx_local->isfail = 0x30;
    ctx_local->malloc = (MOJOSHADER_malloc)ctx->sourcefile;
    *(uint *)&ctx_local->free = ctx->sourceline;
    ctx_local->malloc_data = (void *)0x0;
    ctx_local->errors = (ErrorList *)string;
    *(undefined4 *)&ctx_local->warnings = 0;
  }
  return (MOJOSHADER_astExpression *)ctx_local;
}

Assistant:

static MOJOSHADER_astExpression *new_identifier_expr(Context *ctx,
                                                     const char *string)
{
    NEW_AST_NODE(retval, MOJOSHADER_astExpressionIdentifier,
                 MOJOSHADER_AST_OP_IDENTIFIER);
    retval->datatype = NULL;
    retval->identifier = string;  // cached; don't copy string.
    retval->index = 0;
    return (MOJOSHADER_astExpression *) retval;
}